

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase317::run(TestCase317 *this)

{
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_short>>
            ((Bounded<5UL,_unsigned_short>)0x3,(Bounded<5UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_short>>
            ((Bounded<5UL,_unsigned_short>)0x3,(Bounded<5UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x2,(Bounded<4UL,_unsigned_short>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x2,(Bounded<4UL,_unsigned_short>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_char>>
            ((Bounded<5UL,_unsigned_char>)0x4,(Bounded<5UL,_unsigned_char>)0x4);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<5ul,unsigned_char>>
            ((Bounded<5UL,_unsigned_char>)0x4,(Bounded<5UL,_unsigned_char>)0x4);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_char>>
            ((Bounded<4UL,_unsigned_char>)0x2,(Bounded<4UL,_unsigned_char>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_char>>
            ((Bounded<4UL,_unsigned_char>)0x2,(Bounded<4UL,_unsigned_char>)0x2);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  (anonymous_namespace)::assertTypeAndValue<kj::Bounded<4ul,unsigned_short>>
            ((Bounded<4UL,_unsigned_short>)0x3,(Bounded<4UL,_unsigned_short>)0x3);
  return;
}

Assistant:

TEST(AsyncUnixTest, SignalsNoWait) {
  // Verify that UnixEventPort::poll() correctly receives pending signals.

  captureSignals();
  UnixEventPort port;
  EventLoop loop(port);
  WaitScope waitScope(loop);

  bool receivedSigurg = false;
  bool receivedSigio = false;
  port.onSignal(SIGURG).then([&](siginfo_t&& info) {
    receivedSigurg = true;
    EXPECT_EQ(SIGURG, info.si_signo);
    EXPECT_SI_CODE(SI_USER, info.si_code);
  }).detach([](Exception&& e) { KJ_FAIL_EXPECT(e); });
  port.onSignal(SIGIO).then([&](siginfo_t&& info) {
    receivedSigio = true;
    EXPECT_EQ(SIGIO, info.si_signo);
    EXPECT_SI_CODE(SI_USER, info.si_code);
  }).detach([](Exception&& e) { KJ_FAIL_EXPECT(e); });

  kill(getpid(), SIGURG);
  kill(getpid(), SIGIO);

  EXPECT_FALSE(receivedSigurg);
  EXPECT_FALSE(receivedSigio);

  loop.run();

  EXPECT_FALSE(receivedSigurg);
  EXPECT_FALSE(receivedSigio);

  port.poll();

  EXPECT_FALSE(receivedSigurg);
  EXPECT_FALSE(receivedSigio);

  loop.run();

  EXPECT_TRUE(receivedSigurg);
  EXPECT_TRUE(receivedSigio);
}